

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O3

void __thiscall BMRS<UFPC>::SecondScan(BMRS<UFPC> *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  Mat1i *pMVar4;
  uint64_t *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint *puVar9;
  Run *pRVar10;
  ushort uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar21;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar2 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  puVar9 = UFPC::P_;
  pRVar10 = (this->data_runs).runs;
  if (1 < (int)uVar2) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar5 = (this->data_compressed).bits;
    lVar14 = *(long *)&pMVar4->field_0x10;
    lVar16 = **(long **)&pMVar4->field_0x48;
    lVar17 = lVar14 + lVar16;
    lVar16 = lVar16 * 2;
    uVar18 = 0;
    do {
      uVar11 = pRVar10->start_pos;
      if (uVar11 != 0xffff) {
        iVar21 = (this->data_compressed).data_width;
        iVar13 = (int)uVar18 * iVar21;
        do {
          uVar1 = pRVar10->end_pos;
          if (uVar11 < uVar1) {
            uVar3 = puVar9[pRVar10->label];
            uVar12 = (ulong)uVar11;
            do {
              uVar19 = uVar12 >> 6 & 0x3ffffff;
              if ((puVar5[(long)(iVar13 * 2) + uVar19] >> (uVar12 & 0x3f) & 1) != 0) {
                *(uint *)(lVar14 + uVar12 * 4) = uVar3;
              }
              if ((puVar5[(long)(iVar13 * 2) + (long)iVar21 + uVar19] & 1L << ((byte)uVar12 & 0x3f))
                  != 0) {
                *(uint *)(lVar17 + uVar12 * 4) = uVar3;
              }
              uVar12 = uVar12 + 1;
            } while (uVar1 != uVar12);
          }
          uVar11 = pRVar10[1].start_pos;
          pRVar10 = pRVar10 + 1;
        } while (uVar11 != 0xffff);
      }
      pRVar10 = pRVar10 + 1;
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + lVar16;
      lVar14 = lVar14 + lVar16;
    } while (uVar18 != uVar2 >> 1);
  }
  puVar9 = UFPC::P_;
  auVar8 = _DAT_00328440;
  auVar7 = _DAT_00328430;
  auVar6 = _DAT_00328420;
  if (((uVar2 & 1) != 0) && (uVar11 = pRVar10->start_pos, uVar11 != 0xffff)) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar17 = **(long **)&pMVar4->field_0x48;
    lVar14 = *(long *)&pMVar4->field_0x10;
    do {
      if (uVar11 < pRVar10->end_pos) {
        uVar3 = puVar9[pRVar10->label];
        lVar15 = (ulong)pRVar10->end_pos - (ulong)uVar11;
        lVar16 = lVar15 + -1;
        auVar20._8_4_ = (int)lVar16;
        auVar20._0_8_ = lVar16;
        auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
        lVar16 = lVar14 + (int)(uVar2 - 1) * lVar17 + 0xc + (ulong)uVar11 * 4;
        auVar20 = auVar20 ^ auVar8;
        uVar18 = 0;
        do {
          auVar22._8_4_ = (int)uVar18;
          auVar22._0_8_ = uVar18;
          auVar22._12_4_ = (int)(uVar18 >> 0x20);
          auVar23 = (auVar22 | auVar7) ^ auVar8;
          iVar21 = auVar20._4_4_;
          if ((bool)(~(iVar21 < auVar23._4_4_ ||
                      auVar20._0_4_ < auVar23._0_4_ && auVar23._4_4_ == iVar21) & 1)) {
            *(uint *)(lVar16 + -0xc + uVar18 * 4) = uVar3;
          }
          if (auVar23._12_4_ <= auVar20._12_4_ &&
              (auVar23._8_4_ <= auVar20._8_4_ || auVar23._12_4_ != auVar20._12_4_)) {
            *(uint *)(lVar16 + -8 + uVar18 * 4) = uVar3;
          }
          auVar22 = (auVar22 | auVar6) ^ auVar8;
          iVar13 = auVar22._4_4_;
          if (iVar13 <= iVar21 && (iVar13 != iVar21 || auVar22._0_4_ <= auVar20._0_4_)) {
            *(uint *)(lVar16 + -4 + uVar18 * 4) = uVar3;
            *(uint *)(lVar16 + uVar18 * 4) = uVar3;
          }
          uVar18 = uVar18 + 4;
        } while ((lVar15 + 3U & 0xfffffffffffffffc) != uVar18);
      }
      uVar11 = pRVar10[1].start_pos;
      pRVar10 = pRVar10 + 1;
    } while (uVar11 != 0xffff);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (int j = start_pos; j < end_pos; j++) {
                    if (data_u[j >> 6] & (1ull << (j & 0x3F))) labels_u[j] = label;
                    if (data_d[j >> 6] & (1ull << (j & 0x3F))) labels_d[j] = label;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }
    }